

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::update_dht_announce_interval(session_impl *this)

{
  service_type *psVar1;
  ulong uVar2;
  int iVar3;
  long *plVar4;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6604:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  int iVar5;
  ulong uVar6;
  char *fmt;
  undefined8 uVar7;
  anon_class_8_1_8991fb9c local_48;
  ptr local_40;
  
  if ((this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    fmt = "not starting DHT announce timer: m_dht == nullptr";
  }
  else {
    this->m_dht_interval_update_torrents =
         (int)((ulong)((long)(this->m_torrents).m_array.
                             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_torrents).m_array.
                            super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4);
    if (this->m_abort != true) {
      iVar3 = session_settings::get_int(&this->m_settings,0x4044);
      iVar5 = (int)((ulong)((long)(this->m_torrents).m_array.
                                  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_torrents).m_array.
                                 super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      uVar6 = (long)(iVar3 * 1000) / (long)iVar5;
      uVar2 = 1;
      if (1 < (int)uVar6) {
        uVar2 = uVar6;
      }
      uVar6 = 4000;
      if ((int)uVar2 < 4000) {
        uVar6 = uVar2 & 0xffffffff;
      }
      if ((this->m_dht_torrents).
          super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->m_dht_torrents).
          super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        uVar6 = uVar2 & 0xffffffff;
      }
      local_40.h = (anon_class_8_1_8991fb9c *)(uVar6 * 1000000);
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::expires_after(&this->m_dht_announce_timer,(duration *)&local_40);
      psVar1 = (this->m_dht_announce_timer).impl_.service_;
      local_48.this = this;
      local_40.h = &local_48;
      plVar4 = (long *)__tls_get_addr(&PTR_004d3f18);
      if (*plVar4 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(undefined8 *)(*plVar4 + 8);
      }
      op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6604:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            *)boost::asio::detail::thread_info_base::
              allocate<boost::asio::detail::thread_info_base::default_tag>(uVar7,0x60);
      (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
      (op->super_wait_op).super_operation.func_ =
           boost::asio::detail::
           wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:6604:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           ::do_complete;
      (op->super_wait_op).super_operation.task_result_ = 0;
      (op->super_wait_op).ec_.val_ = 0;
      (op->super_wait_op).ec_.failed_ = false;
      (op->super_wait_op).ec_.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      (op->handler_).this = local_48.this;
      local_40.v = op;
      boost::asio::detail::
      handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
      ::handler_work_base(&(op->work_).
                           super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                          ,&(this->m_dht_announce_timer).impl_.executor_);
      (this->m_dht_announce_timer).impl_.implementation_.might_have_pending_waits = true;
      local_40.p = op;
      boost::asio::detail::epoll_reactor::
      schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar1->scheduler_,&psVar1->timer_queue_,
                 &(this->m_dht_announce_timer).impl_.implementation_.expiry,
                 &(this->m_dht_announce_timer).impl_.implementation_.timer_data,(wait_op *)op);
      local_40.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6604:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)0x0;
      local_40.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6604:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)0x0;
      boost::asio::detail::
      wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:6604:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::ptr::reset(&local_40);
      return;
    }
    fmt = "not starting DHT announce timer: m_abort set";
  }
  session_log(this,fmt);
  return;
}

Assistant:

void session_impl::update_dht_announce_interval()
	{
#ifndef TORRENT_DISABLE_DHT
		if (!m_dht)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("not starting DHT announce timer: m_dht == nullptr");
#endif
			return;
		}

		m_dht_interval_update_torrents = int(m_torrents.size());

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("not starting DHT announce timer: m_abort set");
#endif
			return;
		}

		ADD_OUTSTANDING_ASYNC("session_impl::on_dht_announce");
		int delay = std::max(1000 * m_settings.get_int(settings_pack::dht_announce_interval)
			/ std::max(int(m_torrents.size()), 1), 1);

		if (!m_dht_torrents.empty())
		{
			// we have prioritized torrents that need
			// an initial DHT announce. Don't wait too long
			// until we announce those.
			delay = std::min(4000, delay);
		}

		m_dht_announce_timer.expires_after(milliseconds(delay));
		m_dht_announce_timer.async_wait([this](error_code const& e) {
			wrap(&session_impl::on_dht_announce, e); });
#endif
	}